

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

undefined8 __thiscall svg::Fill::toString_abi_cxx11_(Fill *this,Layout *layout)

{
  undefined8 in_RDI;
  stringstream ss;
  allocator local_239;
  string local_238 [32];
  string local_218 [55];
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [216];
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  Layout *in_stack_ffffffffffffff60;
  Color *in_stack_ffffffffffffff68;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"fill",&local_1e1);
  Color::toString_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"",&local_239);
  attribute<std::__cxx11::string>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::operator<<(local_190,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_218);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("fill", color.toString(layout));
            return ss.str();
        }